

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

TreeEnsembleClassifier * __thiscall
CoreML::Specification::Model::mutable_treeensembleclassifier(Model *this)

{
  TreeEnsembleClassifier *this_00;
  
  if (this->_oneof_case_[0] == 0x192) {
    this_00 = (TreeEnsembleClassifier *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x192;
    this_00 = (TreeEnsembleClassifier *)operator_new(0x30);
    TreeEnsembleClassifier::TreeEnsembleClassifier(this_00);
    (this->Type_).treeensembleclassifier_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::TreeEnsembleClassifier* Model::mutable_treeensembleclassifier() {
  if (!has_treeensembleclassifier()) {
    clear_Type();
    set_has_treeensembleclassifier();
    Type_.treeensembleclassifier_ = new ::CoreML::Specification::TreeEnsembleClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.treeEnsembleClassifier)
  return Type_.treeensembleclassifier_;
}